

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorConstructor_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint column,GLuint size)

{
  GLchar *__s;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48 [32];
  string *local_28;
  string *type_name;
  GLuint size_local;
  GLuint column_local;
  InitializerListTest *this_local;
  string *result;
  
  type_name._0_4_ = size;
  type_name._4_4_ = column;
  _size_local = this;
  this_local = (InitializerListTest *)__return_storage_ptr__;
  __s = Utils::getTypeName(FLOAT,1,size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_28 = local_48;
  local_5d = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getVectorValues_abi_cxx11_(&local_80,this,type_name._4_4_,(GLuint)type_name);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_5d = 1;
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorConstructor(GLuint column, GLuint size)
{
	const std::string& type_name = Utils::getTypeName(Utils::FLOAT, 1 /*n_cols*/, size);

	std::string result;

	result.append(type_name);
	result.append("(");
	result.append(getVectorValues(column, size));
	result.append(")");

	return result;
}